

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall
cmCPackIFWResourcesParser::CharacterDataHandler
          (cmCPackIFWResourcesParser *this,char *data,int length)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string destination;
  undefined1 local_98 [8];
  string source;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string content;
  int length_local;
  char *data_local;
  cmCPackIFWResourcesParser *this_local;
  
  if ((this->file & 1U) != 0) {
    content.field_2._12_4_ = length;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)local_40,data,data + length,&local_41);
    std::allocator<char>::~allocator(&local_41);
    cmSystemTools::TrimWhitespace((string *)((long)&source.field_2 + 8),(string *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)(source.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(source.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&destination.field_2 + 8),&this->basePath,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&destination.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::~string((string *)(destination.field_2._M_local_buf + 8));
    std::operator+(&local_f8,&this->path,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::~string((string *)&local_f8);
    bVar1 = cmsys::SystemTools::CopyFileIfDifferent((string *)local_98,(string *)local_d8);
    if (!bVar1) {
      this->hasErrors = true;
    }
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void CharacterDataHandler(const char* data, int length) override
  {
    if (this->file) {
      std::string content(data, data + length);
      content = cmSystemTools::TrimWhitespace(content);
      std::string source = this->basePath + "/" + content;
      std::string destination = this->path + "/" + content;
      if (!cmSystemTools::CopyFileIfDifferent(source, destination)) {
        this->hasErrors = true;
      }
    }
  }